

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

void __thiscall CentralBroker::CentralBroker(CentralBroker *this,char *endP)

{
  (this->endpoint)._M_dataplus._M_p = (pointer)&(this->endpoint).field_2;
  (this->endpoint)._M_string_length = 0;
  (this->endpoint).field_2._M_local_buf[0] = '\0';
  (this->address)._M_dataplus._M_p = (pointer)&(this->address).field_2;
  (this->address)._M_string_length = 0;
  (this->address).field_2._M_local_buf[0] = '\0';
  create(this,endP);
  return;
}

Assistant:

CentralBroker::CentralBroker(const char* endP) {
    create(endP);
}